

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O1

int __thiscall ztimer::TimerManager::UnRegisterTimer(TimerManager *this,unsigned_long timerId)

{
  uint uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  int iVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  _Hash_node_base *local_30;
  
  local_30 = (_Hash_node_base *)timerId;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  iVar4 = 4;
  if (local_30 != (_Hash_node_base *)0x0) {
    uVar2 = (this->timerMap)._M_h._M_bucket_count;
    uVar6 = (ulong)local_30 % uVar2;
    p_Var7 = (this->timerMap)._M_h._M_buckets[uVar6];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var7->_M_nxt[1]._M_nxt != local_30)) {
      while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar6) ||
           (p_Var8 = p_Var7, p_Var3[1]._M_nxt == local_30)) goto LAB_0011cb4c;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_0011cb4c:
    if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
      pmVar5 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->timerMap,(key_type *)&local_30);
      uVar1 = *pmVar5;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->timerMap)._M_h,&local_30);
      uVar2 = (this->AbsTimerMap)._M_h._M_bucket_count;
      uVar6 = (ulong)local_30 % uVar2;
      p_Var7 = (this->AbsTimerMap)._M_h._M_buckets[uVar6];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var7 != (__node_base_ptr)0x0) &&
         (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, local_30 != p_Var7->_M_nxt[1]._M_nxt)) {
        while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar2 != uVar6) ||
             (p_Var8 = p_Var7, local_30 == p_Var3[1]._M_nxt)) goto LAB_0011cbdf;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_0011cbdf:
      if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->AbsTimerMap)._M_h,&local_30);
      }
      iVar4 = 0;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->timeWheel).
                  super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_h,&local_30);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar4;
}

Assistant:

int TimerManager::UnRegisterTimer(unsigned long timerId)
    {
        std::lock_guard<std::mutex> lk(mtx);
        if (!TimerValid(timerId) || !TimerExist(timerId)) {
            return ERR_TIMER_ID_INVALID_NOT_EXIST;
        }
        unsigned int pos = timerMap[timerId];
        timerMap.erase(timerId);
        if (AbsTimerMap.find(timerId) != AbsTimerMap.end()) {
            AbsTimerMap.erase(timerId);
        }
        timeWheel[pos].erase(timerId);
        return ERR_OK;
    }